

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.h
# Opt level: O2

bool __thiscall UnifiedRegex::Node::IsSimpleOneChar(Node *this)

{
  bool bVar1;
  
  if ((((this->features & 0x110e) == 0) && ((*(uint *)&this->field_0xc & 2) == 0)) &&
     ((*(uint *)&this->field_0xc & 1) != 0)) {
    bVar1 = (this->thisConsumes).upper == 1 && (this->thisConsumes).lower == 1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool IsSimpleOneChar() { return IsSimple() && !isThisIrrefutable && isFirstExact && thisConsumes.IsExact(1); }